

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint uVar23;
  undefined4 uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  Primitive *prim;
  ulong uVar32;
  ulong *puVar33;
  undefined1 auVar34 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar35;
  undefined1 in_ZMM0 [64];
  undefined1 auVar36 [16];
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 ai_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 ai_3;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_3;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 ai_2;
  undefined1 auVar55 [16];
  vint4 bi_2;
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  Precalculations pre;
  vbool<4> valid_leaf;
  vint<4> octant;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_2701;
  ulong local_2700;
  ulong uStack_26f8;
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  AccelData *local_26b8;
  ulong local_26b0;
  RayHitK<4> *local_26a8;
  RayQueryContext *local_26a0;
  ulong local_2698;
  ulong local_2690;
  ulong local_2688;
  undefined1 local_2680 [32];
  undefined1 local_2650 [16];
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float local_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  undefined1 local_2610 [16];
  undefined4 local_2600;
  undefined4 uStack_25fc;
  undefined4 uStack_25f8;
  undefined4 uStack_25f4;
  undefined4 uStack_25f0;
  undefined4 uStack_25ec;
  undefined4 uStack_25e8;
  undefined4 uStack_25e4;
  undefined4 local_25e0;
  undefined4 uStack_25dc;
  undefined4 uStack_25d8;
  undefined4 uStack_25d4;
  undefined1 local_25d0 [16];
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float local_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  uint local_2560;
  uint uStack_255c;
  uint uStack_2558;
  uint uStack_2554;
  uint uStack_2550;
  uint uStack_254c;
  uint uStack_2548;
  uint uStack_2544;
  undefined4 local_2540;
  undefined4 uStack_253c;
  undefined4 uStack_2538;
  undefined4 uStack_2534;
  undefined4 uStack_2530;
  undefined4 uStack_252c;
  undefined4 uStack_2528;
  undefined4 uStack_2524;
  uint local_2520;
  uint uStack_251c;
  uint uStack_2518;
  uint uStack_2514;
  uint uStack_2510;
  uint uStack_250c;
  uint uStack_2508;
  uint uStack_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  uint local_2460;
  uint uStack_245c;
  uint uStack_2458;
  uint uStack_2454;
  uint uStack_2450;
  uint uStack_244c;
  uint uStack_2448;
  uint uStack_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  uint local_2420;
  uint uStack_241c;
  uint uStack_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar37 [64];
  
  auVar5 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar34 = vpcmpeqd_avx(auVar5,(undefined1  [16])valid_i->field_0);
  uVar23 = vmovmskps_avx(auVar34);
  if (uVar23 != 0) {
    local_26b8 = This->ptr;
    local_26b0 = (ulong)(uVar23 & 0xff);
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar36 = *(undefined1 (*) [16])(ray + 0x40);
    auVar38 = vandps_avx(auVar36,auVar40);
    auVar45._8_4_ = 0x219392ef;
    auVar45._0_8_ = 0x219392ef219392ef;
    auVar45._12_4_ = 0x219392ef;
    auVar38 = vcmpps_avx(auVar38,auVar45,1);
    auVar41 = vblendvps_avx(auVar36,auVar45,auVar38);
    auVar38 = *(undefined1 (*) [16])(ray + 0x50);
    auVar44 = vandps_avx(auVar38,auVar40);
    auVar44 = vcmpps_avx(auVar44,auVar45,1);
    auVar43 = vblendvps_avx(auVar38,auVar45,auVar44);
    auVar44 = *(undefined1 (*) [16])(ray + 0x60);
    auVar40 = vandps_avx(auVar44,auVar40);
    auVar40 = vcmpps_avx(auVar40,auVar45,1);
    auVar40 = vblendvps_avx(auVar44,auVar45,auVar40);
    auVar45 = vrcpps_avx(auVar41);
    auVar52._8_4_ = 0x3f800000;
    auVar52._0_8_ = 0x3f8000003f800000;
    auVar52._12_4_ = 0x3f800000;
    auVar41 = vfnmadd213ps_fma(auVar41,auVar45,auVar52);
    local_2570 = vfmadd132ps_fma(auVar41,auVar45,auVar45);
    auVar59 = ZEXT1664(local_2570);
    auVar41 = vrcpps_avx(auVar43);
    auVar43 = vfnmadd213ps_fma(auVar43,auVar41,auVar52);
    local_2580 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
    auVar60 = ZEXT1664(local_2580);
    auVar41 = vrcpps_avx(auVar40);
    auVar40 = vfnmadd213ps_fma(auVar40,auVar41,auVar52);
    local_2590 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
    auVar61 = ZEXT1664(local_2590);
    auVar40 = ZEXT816(0) << 0x20;
    local_2650 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar40);
    local_25d0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40);
    auVar36 = vcmpps_avx(auVar36,auVar40,1);
    auVar41._8_4_ = 1;
    auVar41._0_8_ = 0x100000001;
    auVar41._12_4_ = 1;
    auVar36 = vandps_avx(auVar36,auVar41);
    auVar38 = vcmpps_avx(auVar38,auVar40,1);
    auVar43._8_4_ = 2;
    auVar43._0_8_ = 0x200000002;
    auVar43._12_4_ = 2;
    auVar38 = vandps_avx(auVar38,auVar43);
    auVar38 = vorps_avx(auVar38,auVar36);
    auVar36 = vcmpps_avx(auVar44,auVar40,1);
    auVar44._8_4_ = 4;
    auVar44._0_8_ = 0x400000004;
    auVar44._12_4_ = 4;
    auVar36 = vandps_avx(auVar36,auVar44);
    auVar5 = vpor_avx(auVar34 ^ auVar5,auVar36);
    local_2610 = vpor_avx(auVar5,auVar38);
    local_25a0 = *(float *)ray;
    fStack_259c = *(float *)(ray + 4);
    fStack_2598 = *(float *)(ray + 8);
    fStack_2594 = *(float *)(ray + 0xc);
    local_25b0 = *(float *)(ray + 0x10);
    fStack_25ac = *(float *)(ray + 0x14);
    fStack_25a8 = *(float *)(ray + 0x18);
    fStack_25a4 = *(float *)(ray + 0x1c);
    local_25c0 = *(float *)(ray + 0x20);
    fStack_25bc = *(float *)(ray + 0x24);
    fStack_25b8 = *(float *)(ray + 0x28);
    fStack_25b4 = *(float *)(ray + 0x2c);
    local_2560 = 0x80000000;
    uStack_255c = 0x80000000;
    uStack_2558 = 0x80000000;
    uStack_2554 = 0x80000000;
    uStack_2550 = 0x80000000;
    uStack_254c = 0x80000000;
    uStack_2548 = 0x80000000;
    uStack_2544 = 0x80000000;
    local_25e0 = 0x7f800000;
    uStack_25dc = 0x7f800000;
    uStack_25d8 = 0x7f800000;
    uStack_25d4 = 0x7f800000;
    local_2620 = local_2570._0_4_ * -*(float *)ray;
    fStack_261c = local_2570._4_4_ * -*(float *)(ray + 4);
    fStack_2618 = local_2570._8_4_ * -*(float *)(ray + 8);
    fStack_2614 = local_2570._12_4_ * -*(float *)(ray + 0xc);
    local_2630 = local_2580._0_4_ * -*(float *)(ray + 0x10);
    fStack_262c = local_2580._4_4_ * -*(float *)(ray + 0x14);
    fStack_2628 = local_2580._8_4_ * -*(float *)(ray + 0x18);
    fStack_2624 = local_2580._12_4_ * -*(float *)(ray + 0x1c);
    local_2640 = local_2590._0_4_ * -*(float *)(ray + 0x20);
    fStack_263c = local_2590._4_4_ * -*(float *)(ray + 0x24);
    fStack_2638 = local_2590._8_4_ * -*(float *)(ray + 0x28);
    fStack_2634 = local_2590._12_4_ * -*(float *)(ray + 0x2c);
    local_26a8 = ray;
    local_26a0 = context;
    do {
      lVar25 = 0;
      for (uVar28 = local_26b0; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar24 = *(undefined4 *)(local_2610 + lVar25 * 4);
      auVar34._4_4_ = uVar24;
      auVar34._0_4_ = uVar24;
      auVar34._8_4_ = uVar24;
      auVar34._12_4_ = uVar24;
      auVar42 = vpcmpeqd_avx(auVar34,local_2610);
      uVar24 = vmovmskps_avx(auVar42);
      local_26b0 = ~CONCAT44((int)((ulong)lVar25 >> 0x20),uVar24) & local_26b0;
      auVar7._4_4_ = fStack_259c;
      auVar7._0_4_ = local_25a0;
      auVar7._8_4_ = fStack_2598;
      auVar7._12_4_ = fStack_2594;
      auVar53._8_4_ = 0x7f800000;
      auVar53._0_8_ = 0x7f8000007f800000;
      auVar53._12_4_ = 0x7f800000;
      auVar5 = vblendvps_avx(auVar53,auVar7,auVar42);
      auVar34 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vminps_avx(auVar34,auVar5);
      auVar34 = vshufpd_avx(auVar5,auVar5,1);
      auVar34 = vminps_avx(auVar34,auVar5);
      auVar6._4_4_ = fStack_25ac;
      auVar6._0_4_ = local_25b0;
      auVar6._8_4_ = fStack_25a8;
      auVar6._12_4_ = fStack_25a4;
      auVar5 = vblendvps_avx(auVar53,auVar6,auVar42);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vminps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar36 = vminps_avx(auVar36,auVar5);
      auVar4._4_4_ = fStack_25bc;
      auVar4._0_4_ = local_25c0;
      auVar4._8_4_ = fStack_25b8;
      auVar4._12_4_ = fStack_25b4;
      auVar5 = vblendvps_avx(auVar53,auVar4,auVar42);
      auVar34 = vinsertps_avx(auVar34,auVar36,0x1c);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vminps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar5 = vminps_avx(auVar36,auVar5);
      auVar38 = vinsertps_avx(auVar34,auVar5,0x20);
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      auVar5 = vblendvps_avx(auVar55,auVar7,auVar42);
      auVar34 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vmaxps_avx(auVar34,auVar5);
      auVar34 = vshufpd_avx(auVar5,auVar5,1);
      auVar34 = vmaxps_avx(auVar34,auVar5);
      auVar5 = vblendvps_avx(auVar55,auVar6,auVar42);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vmaxps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar36 = vmaxps_avx(auVar36,auVar5);
      auVar5 = vblendvps_avx(auVar55,auVar4,auVar42);
      auVar34 = vinsertps_avx(auVar34,auVar36,0x1c);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vmaxps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar5 = vmaxps_avx(auVar36,auVar5);
      auVar40 = vinsertps_avx(auVar34,auVar5,0x20);
      auVar5 = vblendvps_avx(auVar53,auVar59._0_16_,auVar42);
      auVar34 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vminps_avx(auVar34,auVar5);
      auVar34 = vshufpd_avx(auVar5,auVar5,1);
      auVar34 = vminps_avx(auVar34,auVar5);
      auVar5 = vblendvps_avx(auVar53,auVar60._0_16_,auVar42);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vminps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar36 = vminps_avx(auVar36,auVar5);
      auVar5 = vblendvps_avx(auVar53,auVar61._0_16_,auVar42);
      auVar34 = vinsertps_avx(auVar34,auVar36,0x1c);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vminps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar5 = vminps_avx(auVar36,auVar5);
      auVar41 = vinsertps_avx(auVar34,auVar5,0x20);
      auVar5 = vblendvps_avx(auVar55,auVar59._0_16_,auVar42);
      auVar34 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vmaxps_avx(auVar34,auVar5);
      auVar34 = vshufpd_avx(auVar5,auVar5,1);
      auVar34 = vmaxps_avx(auVar34,auVar5);
      auVar5 = vblendvps_avx(auVar55,auVar60._0_16_,auVar42);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vmaxps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar36 = vmaxps_avx(auVar36,auVar5);
      auVar5 = vblendvps_avx(auVar55,auVar61._0_16_,auVar42);
      auVar34 = vinsertps_avx(auVar34,auVar36,0x1c);
      auVar36 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar5 = vmaxps_avx(auVar36,auVar5);
      auVar36 = vshufpd_avx(auVar5,auVar5,1);
      auVar5 = vmaxps_avx(auVar36,auVar5);
      auVar43 = vinsertps_avx(auVar34,auVar5,0x20);
      auVar5 = vblendvps_avx(auVar53,local_2650,auVar42);
      auVar34 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar52 = vminps_avx(auVar34,auVar5);
      auVar5 = vblendvps_avx(auVar55,local_25d0,auVar42);
      auVar6 = vshufpd_avx(auVar52,auVar52,1);
      auVar34 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar45 = vmaxps_avx(auVar34,auVar5);
      auVar44 = vcmpps_avx(auVar41,_DAT_01f7aa10,5);
      auVar34 = vblendvps_avx(auVar43,auVar41,auVar44);
      auVar36 = vblendvps_avx(auVar38,auVar40,auVar44);
      auVar7 = vshufpd_avx(auVar45,auVar45,1);
      auVar38 = vblendvps_avx(auVar40,auVar38,auVar44);
      local_23c0 = auVar34._0_4_;
      auVar4 = vmovshdup_avx(auVar34);
      local_2688 = (ulong)(auVar4._0_4_ < 0.0) << 5 | 0x40;
      auVar40 = vshufpd_avx(auVar34,auVar34,1);
      local_26f0 = vmaxps_avx(auVar7,auVar45);
      auVar58 = ZEXT1664(CONCAT412(fStack_2624,
                                   CONCAT48(fStack_2628,CONCAT44(fStack_262c,local_2630))));
      auVar57 = ZEXT1664(CONCAT412(fStack_2614,
                                   CONCAT48(fStack_2618,CONCAT44(fStack_261c,local_2620))));
      uVar32 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
      local_2698 = local_2688 ^ 0x20;
      auVar40 = vminps_avx(auVar6,auVar52);
      auVar44 = vblendvps_avx(auVar41,auVar43,auVar44);
      auVar50._0_4_ = auVar36._0_4_ * local_23c0;
      auVar50._4_4_ = auVar36._4_4_ * auVar34._4_4_;
      auVar50._8_4_ = auVar36._8_4_ * auVar34._8_4_;
      auVar50._12_4_ = auVar36._12_4_ * auVar34._12_4_;
      local_2480 = auVar44._0_4_;
      auVar48._0_4_ = auVar38._0_4_ * local_2480;
      auVar48._4_4_ = auVar38._4_4_ * auVar44._4_4_;
      auVar48._8_4_ = auVar38._8_4_ * auVar44._8_4_;
      auVar48._12_4_ = auVar38._12_4_ * auVar44._12_4_;
      auVar56 = ZEXT1664(CONCAT412(fStack_2634,
                                   CONCAT48(fStack_2638,CONCAT44(fStack_263c,local_2640))));
      local_2690 = (ulong)(local_23c0 < 0.0) << 5;
      uVar28 = local_2690 ^ 0x20;
      local_23a0 = *(ulong *)&local_26b8[1].bounds.bounds0.lower.field_0;
      local_2398[0] = 0;
      fStack_23bc = local_23c0;
      fStack_23b8 = local_23c0;
      fStack_23b4 = local_23c0;
      fStack_23b0 = local_23c0;
      fStack_23ac = local_23c0;
      fStack_23a8 = local_23c0;
      fStack_23a4 = local_23c0;
      local_23e0 = local_2560 ^ (uint)auVar50._0_4_;
      uStack_23dc = uStack_255c ^ (uint)auVar50._0_4_;
      uStack_23d8 = uStack_2558 ^ (uint)auVar50._0_4_;
      uStack_23d4 = uStack_2554 ^ (uint)auVar50._0_4_;
      uStack_23d0 = uStack_2550 ^ (uint)auVar50._0_4_;
      uStack_23cc = uStack_254c ^ (uint)auVar50._0_4_;
      uStack_23c8 = uStack_2548 ^ (uint)auVar50._0_4_;
      uStack_23c4 = uStack_2544 ^ (uint)auVar50._0_4_;
      local_2400 = auVar4._0_8_;
      uStack_23f8 = local_2400;
      uStack_23f0 = local_2400;
      uStack_23e8 = local_2400;
      auVar36 = vmovshdup_avx(auVar50);
      uVar23 = auVar36._0_4_;
      uVar8 = auVar36._4_4_;
      local_2420 = local_2560 ^ uVar23;
      uStack_241c = uStack_255c ^ uVar8;
      uStack_2418 = uStack_2558 ^ uVar23;
      uStack_2414 = uStack_2554 ^ uVar8;
      uStack_2410 = uStack_2550 ^ uVar23;
      uStack_240c = uStack_254c ^ uVar8;
      uStack_2408 = uStack_2548 ^ uVar23;
      uStack_2404 = uStack_2544 ^ uVar8;
      auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
      local_2440 = auVar34._0_8_;
      uStack_2438 = local_2440;
      uStack_2430 = local_2440;
      uStack_2428 = local_2440;
      auVar34 = vshufps_avx(auVar50,auVar50,0xaa);
      uVar23 = auVar34._0_4_;
      uVar8 = auVar34._4_4_;
      local_2460 = local_2560 ^ uVar23;
      uStack_245c = uStack_255c ^ uVar8;
      uStack_2458 = uStack_2558 ^ uVar23;
      uStack_2454 = uStack_2554 ^ uVar8;
      uStack_2450 = uStack_2550 ^ uVar23;
      uStack_244c = uStack_254c ^ uVar8;
      uStack_2448 = uStack_2548 ^ uVar23;
      uStack_2444 = uStack_2544 ^ uVar8;
      fStack_247c = local_2480;
      fStack_2478 = local_2480;
      fStack_2474 = local_2480;
      fStack_2470 = local_2480;
      fStack_246c = local_2480;
      fStack_2468 = local_2480;
      fStack_2464 = local_2480;
      local_24a0 = local_2560 ^ (uint)auVar48._0_4_;
      uStack_249c = uStack_255c ^ (uint)auVar48._0_4_;
      uStack_2498 = uStack_2558 ^ (uint)auVar48._0_4_;
      uStack_2494 = uStack_2554 ^ (uint)auVar48._0_4_;
      uStack_2490 = uStack_2550 ^ (uint)auVar48._0_4_;
      uStack_248c = uStack_254c ^ (uint)auVar48._0_4_;
      uStack_2488 = uStack_2548 ^ (uint)auVar48._0_4_;
      uStack_2484 = uStack_2544 ^ (uint)auVar48._0_4_;
      auVar34 = vmovshdup_avx(auVar44);
      local_24c0 = auVar34._0_8_;
      uStack_24b8 = local_24c0;
      uStack_24b0 = local_24c0;
      uStack_24a8 = local_24c0;
      auVar34 = vmovshdup_avx(auVar48);
      uVar23 = auVar34._0_4_;
      uVar8 = auVar34._4_4_;
      local_24e0 = local_2560 ^ uVar23;
      uStack_24dc = uStack_255c ^ uVar8;
      uStack_24d8 = uStack_2558 ^ uVar23;
      uStack_24d4 = uStack_2554 ^ uVar8;
      uStack_24d0 = uStack_2550 ^ uVar23;
      uStack_24cc = uStack_254c ^ uVar8;
      uStack_24c8 = uStack_2548 ^ uVar23;
      uStack_24c4 = uStack_2544 ^ uVar8;
      auVar34 = vshufps_avx(auVar44,auVar44,0xaa);
      local_2500 = auVar34._0_8_;
      uStack_24f8 = local_2500;
      uStack_24f0 = local_2500;
      uStack_24e8 = local_2500;
      auVar34 = vshufps_avx(auVar48,auVar48,0xaa);
      uVar23 = auVar34._0_4_;
      uVar8 = auVar34._4_4_;
      local_2520 = local_2560 ^ uVar23;
      uStack_251c = uStack_255c ^ uVar8;
      uStack_2518 = uStack_2558 ^ uVar23;
      uStack_2514 = uStack_2554 ^ uVar8;
      uStack_2510 = uStack_2550 ^ uVar23;
      uStack_250c = uStack_254c ^ uVar8;
      uStack_2508 = uStack_2548 ^ uVar23;
      uStack_2504 = uStack_2544 ^ uVar8;
      local_2540 = auVar40._0_4_;
      uStack_253c = local_2540;
      uStack_2538 = local_2540;
      uStack_2534 = local_2540;
      uStack_2530 = local_2540;
      uStack_252c = local_2540;
      uStack_2528 = local_2540;
      uStack_2524 = local_2540;
      auVar47 = ZEXT1664(auVar5);
      auVar5._4_4_ = uStack_25dc;
      auVar5._0_4_ = local_25e0;
      auVar5._8_4_ = uStack_25d8;
      auVar5._12_4_ = uStack_25d4;
      local_26d0 = vblendvps_avx(auVar5,local_2650,auVar42);
      puVar33 = local_2390;
      local_2600 = local_26f0._0_4_;
      uStack_25fc = local_26f0._0_4_;
      uStack_25f8 = local_26f0._0_4_;
      uStack_25f4 = local_26f0._0_4_;
      uStack_25f0 = local_26f0._0_4_;
      uStack_25ec = local_26f0._0_4_;
      uStack_25e8 = local_26f0._0_4_;
      uStack_25e4 = local_26f0._0_4_;
      do {
        uVar24 = (undefined4)puVar33[-1];
        auVar36._4_4_ = uVar24;
        auVar36._0_4_ = uVar24;
        auVar36._8_4_ = uVar24;
        auVar36._12_4_ = uVar24;
        auVar37 = ZEXT1664(auVar36);
        puVar33 = puVar33 + -2;
        auVar5 = vcmpps_avx(auVar36,auVar47._0_16_,1);
        if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar5 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar5[0xf] < '\0'
           ) {
          uVar29 = *puVar33;
          while ((uVar29 & 8) == 0) {
            auVar21._4_4_ = uStack_23dc;
            auVar21._0_4_ = local_23e0;
            auVar21._8_4_ = uStack_23d8;
            auVar21._12_4_ = uStack_23d4;
            auVar21._16_4_ = uStack_23d0;
            auVar21._20_4_ = uStack_23cc;
            auVar21._24_4_ = uStack_23c8;
            auVar21._28_4_ = uStack_23c4;
            auVar22._4_4_ = fStack_23bc;
            auVar22._0_4_ = local_23c0;
            auVar22._8_4_ = fStack_23b8;
            auVar22._12_4_ = fStack_23b4;
            auVar22._16_4_ = fStack_23b0;
            auVar22._20_4_ = fStack_23ac;
            auVar22._24_4_ = fStack_23a8;
            auVar22._28_4_ = fStack_23a4;
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + local_2690),auVar21,
                                     auVar22);
            auVar19._4_4_ = uStack_241c;
            auVar19._0_4_ = local_2420;
            auVar19._8_4_ = uStack_2418;
            auVar19._12_4_ = uStack_2414;
            auVar19._16_4_ = uStack_2410;
            auVar19._20_4_ = uStack_240c;
            auVar19._24_4_ = uStack_2408;
            auVar19._28_4_ = uStack_2404;
            auVar20._8_8_ = uStack_23f8;
            auVar20._0_8_ = local_2400;
            auVar20._16_8_ = uStack_23f0;
            auVar20._24_8_ = uStack_23e8;
            auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + local_2688),auVar19,
                                      auVar20);
            auVar9 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar34));
            auVar17._4_4_ = uStack_245c;
            auVar17._0_4_ = local_2460;
            auVar17._8_4_ = uStack_2458;
            auVar17._12_4_ = uStack_2454;
            auVar17._16_4_ = uStack_2450;
            auVar17._20_4_ = uStack_244c;
            auVar17._24_4_ = uStack_2448;
            auVar17._28_4_ = uStack_2444;
            auVar18._8_8_ = uStack_2438;
            auVar18._0_8_ = local_2440;
            auVar18._16_8_ = uStack_2430;
            auVar18._24_8_ = uStack_2428;
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar32),auVar17,auVar18)
            ;
            auVar11._4_4_ = uStack_253c;
            auVar11._0_4_ = local_2540;
            auVar11._8_4_ = uStack_2538;
            auVar11._12_4_ = uStack_2534;
            auVar11._16_4_ = uStack_2530;
            auVar11._20_4_ = uStack_252c;
            auVar11._24_4_ = uStack_2528;
            auVar11._28_4_ = uStack_2524;
            auVar10 = vpmaxsd_avx2(ZEXT1632(auVar5),auVar11);
            local_2680 = vpmaxsd_avx2(auVar9,auVar10);
            auVar15._4_4_ = uStack_249c;
            auVar15._0_4_ = local_24a0;
            auVar15._8_4_ = uStack_2498;
            auVar15._12_4_ = uStack_2494;
            auVar15._16_4_ = uStack_2490;
            auVar15._20_4_ = uStack_248c;
            auVar15._24_4_ = uStack_2488;
            auVar15._28_4_ = uStack_2484;
            auVar16._4_4_ = fStack_247c;
            auVar16._0_4_ = local_2480;
            auVar16._8_4_ = fStack_2478;
            auVar16._12_4_ = fStack_2474;
            auVar16._16_4_ = fStack_2470;
            auVar16._20_4_ = fStack_246c;
            auVar16._24_4_ = fStack_2468;
            auVar16._28_4_ = fStack_2464;
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar28),auVar15,auVar16)
            ;
            auVar9._4_4_ = uStack_24dc;
            auVar9._0_4_ = local_24e0;
            auVar9._8_4_ = uStack_24d8;
            auVar9._12_4_ = uStack_24d4;
            auVar9._16_4_ = uStack_24d0;
            auVar9._20_4_ = uStack_24cc;
            auVar9._24_4_ = uStack_24c8;
            auVar9._28_4_ = uStack_24c4;
            auVar14._8_8_ = uStack_24b8;
            auVar14._0_8_ = local_24c0;
            auVar14._16_8_ = uStack_24b0;
            auVar14._24_8_ = uStack_24a8;
            auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + local_2698),auVar9,
                                      auVar14);
            auVar9 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar34));
            auVar12._4_4_ = uStack_251c;
            auVar12._0_4_ = local_2520;
            auVar12._8_4_ = uStack_2518;
            auVar12._12_4_ = uStack_2514;
            auVar12._16_4_ = uStack_2510;
            auVar12._20_4_ = uStack_250c;
            auVar12._24_4_ = uStack_2508;
            auVar12._28_4_ = uStack_2504;
            auVar13._8_8_ = uStack_24f8;
            auVar13._0_8_ = local_2500;
            auVar13._16_8_ = uStack_24f0;
            auVar13._24_8_ = uStack_24e8;
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + (uVar32 ^ 0x20)),auVar12
                                     ,auVar13);
            auVar10._4_4_ = uStack_25fc;
            auVar10._0_4_ = local_2600;
            auVar10._8_4_ = uStack_25f8;
            auVar10._12_4_ = uStack_25f4;
            auVar10._16_4_ = uStack_25f0;
            auVar10._20_4_ = uStack_25ec;
            auVar10._24_4_ = uStack_25e8;
            auVar10._28_4_ = uStack_25e4;
            auVar10 = vpminsd_avx2(ZEXT1632(auVar5),auVar10);
            auVar9 = vpminsd_avx2(auVar9,auVar10);
            auVar9 = vcmpps_avx(local_2680,auVar9,2);
            uVar23 = vmovmskps_avx(auVar9);
            if (uVar23 == 0) goto LAB_005f4298;
            uVar26 = (ulong)(uVar23 & 0xff);
            auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar27 = 0;
            uVar30 = 8;
            do {
              lVar25 = 0;
              for (uVar31 = uVar26; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                lVar25 = lVar25 + 1;
              }
              uVar24 = *(undefined4 *)(uVar29 + 0x40 + lVar25 * 4);
              auVar38._4_4_ = uVar24;
              auVar38._0_4_ = uVar24;
              auVar38._8_4_ = uVar24;
              auVar38._12_4_ = uVar24;
              auVar36 = vfmadd213ps_fma(auVar38,auVar59._0_16_,auVar57._0_16_);
              uVar24 = *(undefined4 *)(uVar29 + 0x80 + lVar25 * 4);
              auVar42._4_4_ = uVar24;
              auVar42._0_4_ = uVar24;
              auVar42._8_4_ = uVar24;
              auVar42._12_4_ = uVar24;
              auVar38 = vfmadd213ps_fma(auVar42,auVar60._0_16_,auVar58._0_16_);
              auVar45 = auVar47._0_16_;
              uVar24 = *(undefined4 *)(uVar29 + 0xc0 + lVar25 * 4);
              auVar46._4_4_ = uVar24;
              auVar46._0_4_ = uVar24;
              auVar46._8_4_ = uVar24;
              auVar46._12_4_ = uVar24;
              auVar44 = vfmadd213ps_fma(auVar46,auVar61._0_16_,auVar56._0_16_);
              uVar24 = *(undefined4 *)(uVar29 + 0x60 + lVar25 * 4);
              auVar49._4_4_ = uVar24;
              auVar49._0_4_ = uVar24;
              auVar49._8_4_ = uVar24;
              auVar49._12_4_ = uVar24;
              auVar40 = vfmadd213ps_fma(auVar49,auVar59._0_16_,auVar57._0_16_);
              uVar24 = *(undefined4 *)(uVar29 + 0xa0 + lVar25 * 4);
              auVar51._4_4_ = uVar24;
              auVar51._0_4_ = uVar24;
              auVar51._8_4_ = uVar24;
              auVar51._12_4_ = uVar24;
              auVar41 = vfmadd213ps_fma(auVar51,auVar60._0_16_,auVar58._0_16_);
              uVar24 = *(undefined4 *)(uVar29 + 0xe0 + lVar25 * 4);
              auVar54._4_4_ = uVar24;
              auVar54._0_4_ = uVar24;
              auVar54._8_4_ = uVar24;
              auVar54._12_4_ = uVar24;
              auVar43 = vfmadd213ps_fma(auVar54,auVar61._0_16_,auVar56._0_16_);
              auVar5 = vpminsd_avx(auVar36,auVar40);
              auVar34 = vpminsd_avx(auVar38,auVar41);
              auVar5 = vpmaxsd_avx(auVar5,auVar34);
              auVar34 = vpminsd_avx(auVar44,auVar43);
              auVar34 = vpmaxsd_avx(auVar34,local_26d0);
              auVar5 = vpmaxsd_avx(auVar5,auVar34);
              auVar34 = vpmaxsd_avx(auVar36,auVar40);
              auVar36 = vpmaxsd_avx(auVar38,auVar41);
              auVar36 = vpminsd_avx(auVar34,auVar36);
              auVar34 = vpmaxsd_avx(auVar44,auVar43);
              auVar47 = ZEXT1664(auVar45);
              auVar34 = vpminsd_avx(auVar34,auVar45);
              auVar34 = vpminsd_avx(auVar36,auVar34);
              auVar5 = vcmpps_avx(auVar5,auVar34,2);
              uVar31 = uVar30;
              if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar5 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar5[0xf] < '\0') {
                uVar24 = *(undefined4 *)(local_2680 + lVar25 * 4);
                auVar39._4_4_ = uVar24;
                auVar39._0_4_ = uVar24;
                auVar39._8_4_ = uVar24;
                auVar39._12_4_ = uVar24;
                uVar31 = *(ulong *)(uVar29 + lVar25 * 8);
                auVar34 = auVar37._0_16_;
                auVar5 = vcmpps_avx(auVar39,auVar34,1);
                if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar5[0xf]) {
                  *puVar33 = uVar31;
                  uVar31 = uVar30;
                }
                else {
                  if (uVar30 == 8) {
                    auVar37 = ZEXT1664(auVar39);
                    goto LAB_005f40b3;
                  }
                  *puVar33 = uVar30;
                  auVar37 = ZEXT1664(auVar39);
                  auVar39 = auVar34;
                }
                uVar27 = uVar27 + 1;
                *(int *)(puVar33 + 1) = auVar39._0_4_;
                puVar33 = puVar33 + 2;
              }
LAB_005f40b3:
              uVar26 = uVar26 - 1 & uVar26;
              uVar30 = uVar31;
            } while (uVar26 != 0);
            if (uVar31 == 8) goto LAB_005f4298;
            uVar29 = uVar31;
            if (1 < uVar27) {
              puVar1 = puVar33 + -4;
              puVar2 = puVar33 + -2;
              if ((uint)puVar33[-3] < (uint)puVar33[-1]) {
                local_2700 = *puVar1;
                uStack_26f8 = puVar33[-3];
                *(int *)(puVar33 + -3) = (int)puVar33[-1];
                *puVar1 = *puVar2;
                *puVar2 = local_2700;
                *(undefined4 *)(puVar33 + -1) = (undefined4)uStack_26f8;
              }
              if (uVar27 != 2) {
                puVar3 = puVar33 + -6;
                uVar23 = (uint)puVar33[-5];
                if (uVar23 < (uint)puVar33[-1]) {
                  local_2700 = *puVar3;
                  uStack_26f8 = puVar33[-5];
                  *(int *)(puVar33 + -5) = (int)puVar33[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = local_2700;
                  *(undefined4 *)(puVar33 + -1) = (undefined4)uStack_26f8;
                  uVar23 = (uint)puVar33[-5];
                }
                if (uVar23 < (uint)puVar33[-3]) {
                  local_2700 = *puVar3;
                  uStack_26f8 = puVar33[-5];
                  *(int *)(puVar33 + -5) = (int)puVar33[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = local_2700;
                  *(undefined4 *)(puVar33 + -3) = (undefined4)uStack_26f8;
                }
              }
            }
          }
          local_26e0 = auVar47._0_16_;
          aVar35 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                   vcmpps_avx(local_26e0,auVar37._0_16_,6);
          local_2680._0_16_ = (undefined1  [16])aVar35;
          if (((((undefined1  [16])aVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
               || ((undefined1  [16])aVar35 >> 0x3f & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0) ||
              ((undefined1  [16])aVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
              || aVar35.i[3]._3_1_ < '\0') {
            lVar25 = (ulong)((uint)uVar29 & 0xf) - 8;
            if (lVar25 != 0) {
              prim = (Primitive *)(uVar29 & 0xfffffffffffffff0);
              do {
                local_2600 = (undefined4)lVar25;
                uStack_25fc = (undefined4)((ulong)lVar25 >> 0x20);
                InstanceIntersectorK<4>::intersect
                          ((vbool<4> *)local_2680,&local_2701,ray,context,prim);
                prim = prim + 1;
                lVar25 = CONCAT44(uStack_25fc,local_2600) + -1;
                context = local_26a0;
                ray = local_26a8;
              } while (lVar25 != 0);
              auVar59 = ZEXT1664(local_2570);
              auVar60 = ZEXT1664(local_2580);
              auVar61 = ZEXT1664(local_2590);
              auVar57 = ZEXT1664(CONCAT412(fStack_2614,
                                           CONCAT48(fStack_2618,CONCAT44(fStack_261c,local_2620))));
              auVar58 = ZEXT1664(CONCAT412(fStack_2624,
                                           CONCAT48(fStack_2628,CONCAT44(fStack_262c,local_2630))));
              auVar56 = ZEXT1664(CONCAT412(fStack_2634,
                                           CONCAT48(fStack_2638,CONCAT44(fStack_263c,local_2640))));
              auVar47 = ZEXT1664(local_26e0);
              aVar35 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)local_2680._0_16_;
            }
            auVar5 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar47._0_16_,1);
            auVar5 = (undefined1  [16])aVar35 & auVar5;
            if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar5 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar5[0xf] < '\0') {
              auVar5 = vblendvps_avx(auVar47._0_16_,*(undefined1 (*) [16])(ray + 0x80),
                                     (undefined1  [16])aVar35);
              auVar47 = ZEXT1664(auVar5);
              auVar34 = vshufps_avx(auVar5,auVar5,0xb1);
              auVar5 = vmaxps_avx(auVar34,auVar5);
              auVar34 = vshufpd_avx(auVar5,auVar5,1);
              local_26f0 = vmaxss_avx(auVar34,auVar5);
            }
          }
        }
        local_2600 = local_26f0._0_4_;
        uStack_25fc = local_2600;
        uStack_25f8 = local_2600;
        uStack_25f4 = local_2600;
        uStack_25f0 = local_2600;
        uStack_25ec = local_2600;
        uStack_25e8 = local_2600;
        uStack_25e4 = local_2600;
LAB_005f4298:
      } while (puVar33 != &local_23a0);
    } while (local_26b0 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }